

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DuplicateFunctionElimination.cpp
# Opt level: O0

void __thiscall
wasm::DuplicateFunctionElimination::~DuplicateFunctionElimination
          (DuplicateFunctionElimination *this)

{
  DuplicateFunctionElimination *this_local;
  
  Pass::~Pass(&this->super_Pass);
  return;
}

Assistant:

bool invalidatesDWARF() override { return true; }